

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t _elemsize;
  int *piVar9;
  void *__ptr;
  Allocator *pAVar10;
  ulong uVar11;
  bool bVar12;
  pointer pMVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int z;
  long lVar17;
  int _woffset;
  int _hoffset;
  int _outw;
  int local_158;
  int local_154;
  int local_150;
  int _outh;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int _outc;
  int _outd;
  int _coffset;
  Mat m_1;
  int _doffset;
  Mat m_2;
  
  local_150 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  iVar3 = bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  if (((this->starts_expr)._M_string_length != 0) && ((this->ends_expr)._M_string_length != 0)) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (&bottom_blobs,1,(allocator_type *)&m_1);
    pMVar13 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start != bottom_blob) {
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = (bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start)->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if ((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
            free((bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
          else {
            (*(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar13->cstep = 0;
      pMVar13->data = (void *)0x0;
      pMVar13->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar13->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar13->elemsize + 4) = 0;
      pMVar13->c = 0;
      pMVar13->dims = 0;
      pMVar13->w = 0;
      pMVar13->h = 0;
      pMVar13->d = 0;
      piVar9 = bottom_blob->refcount;
      pMVar13->data = bottom_blob->data;
      pMVar13->refcount = piVar9;
      pMVar13->elemsize = bottom_blob->elemsize;
      pMVar13->elempack = bottom_blob->elempack;
      pMVar13->allocator = bottom_blob->allocator;
      iVar16 = bottom_blob->w;
      iVar4 = bottom_blob->h;
      iVar5 = bottom_blob->d;
      pMVar13->dims = bottom_blob->dims;
      pMVar13->w = iVar16;
      pMVar13->h = iVar4;
      pMVar13->d = iVar5;
      pMVar13->c = bottom_blob->c;
      pMVar13->cstep = bottom_blob->cstep;
    }
    eval_crop_expr(this,&bottom_blobs,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                   &_outc);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs);
    goto LAB_0024dcb8;
  }
  switch(iVar3) {
  case 1:
    break;
  case 2:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
    goto LAB_0024db78;
  case 3:
    break;
  case 4:
    break;
  default:
    bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    goto LAB_0024db78;
  }
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
LAB_0024db78:
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resolve_crop_roi(this,(Mat *)&bottom_blobs,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,
                   &_outd,&_outc);
  piVar9 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,
                           bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start);
    }
  }
LAB_0024dcb8:
  iVar16 = _outc;
  if (iVar3 == 3) {
    local_158 = iVar15;
    if (_outc == iVar2 && (_outh == iVar15 && _outw == local_150)) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = top_blob->refcount;
      if (piVar9 == (int *)0x0) goto LAB_0024e6f9;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_0024e6f9;
      __ptr = top_blob->data;
      pAVar10 = top_blob->allocator;
    }
    else {
      iVar4 = bottom_blob->w;
      iVar5 = bottom_blob->h;
      iVar6 = bottom_blob->d;
      uVar11 = bottom_blob->elemsize;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)_coffset * bottom_blob->cstep * uVar11 + (long)bottom_blob->data);
      iVar7 = bottom_blob->elempack;
      pAVar10 = bottom_blob->allocator;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar11;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar11 >> 0x20);
      iVar8 = bottom_blob->dims;
      if (_outh != iVar15 || _outw != local_150) {
        Mat::create(top_blob,_outw,_outh,_outc,_elemsize,opt->blob_allocator);
        iVar15 = _hoffset;
        lVar14 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
          bVar12 = false;
        }
        else {
          local_154 = _woffset;
          for (lVar14 = 0; lVar14 < iVar16; lVar14 = lVar14 + 1) {
            m_1.elemsize = CONCAT44(bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                    bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            m_1.data = (void *)((long)&(bottom_blobs.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start)->data +
                               (((long)iVar6 * uVar11 * (long)iVar5 * (long)iVar4 + 0xf &
                                0xfffffffffffffff0) / uVar11) * lVar14 * m_1.elemsize);
            m_1.refcount = (int *)0x0;
            m_1.c = iVar6;
            m_1.d = 1;
            m_1.dims = iVar8 + -1;
            m_1.cstep = (m_1.elemsize * (long)iVar5 * (long)iVar4 + 0xf & 0xfffffffffffffff0) /
                        m_1.elemsize;
            if (iVar8 == 4) {
              m_1.cstep = (long)iVar5 * (long)iVar4;
            }
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar14 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            m_1.elempack = iVar7;
            m_1.allocator = pAVar10;
            m_1.w = iVar4;
            m_1.h = iVar5;
            if (_elemsize == 4) {
              copy_cut_border_image<float>(&m_1,&m_2,iVar15,local_154);
            }
            else if (_elemsize == 2) {
              copy_cut_border_image<unsigned_short>(&m_1,&m_2,iVar15,local_154);
            }
            else if (_elemsize == 1) {
              copy_cut_border_image<signed_char>(&m_1,&m_2,iVar15,local_154);
            }
          }
          bVar12 = true;
        }
        iVar16 = (int)lVar14;
        iVar15 = local_158;
      }
      else {
        Mat::clone(&m_1,(__fn *)&bottom_blobs,opt->blob_allocator,_outh,(void *)(long)iVar4);
        iVar15 = local_158;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar9 = top_blob->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              free(m_1.data);
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (top_blob->data != (void *)0x0) {
          iVar16 = 0;
          bVar12 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) goto LAB_0024e307;
        }
        iVar16 = -100;
        bVar12 = false;
      }
LAB_0024e307:
      piVar9 = (int *)CONCAT44(bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._4_4_,
                               bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_finish._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (pAVar10 == (Allocator *)0x0) {
            free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start);
          }
          else {
            (*pAVar10->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar12) {
        return iVar16;
      }
LAB_0024e349:
      iVar4 = _outd;
      if (iVar3 != 4) {
        return 0;
      }
      bVar12 = iVar1 != _outd;
      local_154 = iVar16;
      if (_outc != iVar2 || (bVar12 || (iVar15 != _outh || local_150 != _outw))) {
        iVar1 = bottom_blob->w;
        iVar2 = bottom_blob->h;
        iVar3 = bottom_blob->d;
        uVar11 = bottom_blob->elemsize;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)_coffset * bottom_blob->cstep * uVar11 + (long)bottom_blob->data);
        iVar16 = bottom_blob->elempack;
        pAVar10 = bottom_blob->allocator;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)uVar11;
        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(uVar11 >> 0x20);
        if (bVar12 || (iVar15 != _outh || local_150 != _outw)) {
          Mat::create(top_blob,_outw,_outh,_outd,_outc,_elemsize,opt->blob_allocator);
          if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
            bVar12 = false;
            iVar15 = -100;
          }
          else {
            for (lVar14 = 0; lVar14 < _outc; lVar14 = lVar14 + 1) {
              for (lVar17 = 0; lVar17 < iVar4; lVar17 = lVar17 + 1) {
                m_1.elemsize = CONCAT44(bottom_blobs.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                        bottom_blobs.
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
                m_1.cstep = (long)iVar2 * (long)iVar1;
                m_1.data = (void *)((long)&(bottom_blobs.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->data +
                                   (long)(_doffset + (int)lVar17) * m_1.elemsize * m_1.cstep +
                                   (((long)iVar3 * uVar11 * (long)iVar2 * (long)iVar1 + 0xf &
                                    0xfffffffffffffff0) / uVar11) * lVar14 * m_1.elemsize);
                m_1.refcount = (int *)0x0;
                m_1.dims = 2;
                m_1.d = 1;
                m_1.c = 1;
                m_2.w = top_blob->w;
                m_2.h = top_blob->h;
                m_2.elemsize = top_blob->elemsize;
                m_2.elempack = top_blob->elempack;
                m_2.allocator = top_blob->allocator;
                m_2.cstep = (long)m_2.h * (long)m_2.w;
                m_2.data = (void *)((long)top_blob->data +
                                   lVar17 * m_2.elemsize * m_2.cstep +
                                   top_blob->cstep * lVar14 * m_2.elemsize);
                m_2.refcount = (int *)0x0;
                m_2.d = 1;
                m_2.c = 1;
                m_1.elempack = iVar16;
                m_1.allocator = pAVar10;
                m_1.w = iVar1;
                m_1.h = iVar2;
                m_2.dims = m_1.dims;
                if (_elemsize == 4) {
                  copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                }
                else if (_elemsize == 2) {
                  copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                }
                else if (_elemsize == 1) {
                  copy_cut_border_image<signed_char>(&m_1,&m_2,_hoffset,_woffset);
                }
              }
            }
            bVar12 = true;
            iVar15 = local_154;
          }
        }
        else {
          Mat::clone(&m_1,(__fn *)&bottom_blobs,opt->blob_allocator,_outh,(void *)(long)iVar1);
          if (&m_1 != top_blob) {
            if (m_1.refcount != (int *)0x0) {
              LOCK();
              *m_1.refcount = *m_1.refcount + 1;
              UNLOCK();
            }
            piVar9 = top_blob->refcount;
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + -1;
              UNLOCK();
              if (*piVar9 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  free(top_blob->data);
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->data = m_1.data;
            top_blob->refcount = m_1.refcount;
            top_blob->elemsize = m_1.elemsize;
            top_blob->elempack = m_1.elempack;
            top_blob->allocator = m_1.allocator;
            top_blob->dims = m_1.dims;
            top_blob->w = m_1.w;
            top_blob->h = m_1.h;
            top_blob->d = m_1.d;
            top_blob->c = m_1.c;
            top_blob->cstep = m_1.cstep;
          }
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + -1;
            UNLOCK();
            if (*m_1.refcount == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (top_blob->data != (void *)0x0) {
            bVar12 = false;
            iVar15 = 0;
            if ((long)top_blob->c * top_blob->cstep != 0) goto LAB_0024e7ff;
          }
          bVar12 = false;
          iVar15 = -100;
        }
LAB_0024e7ff:
        piVar9 = (int *)CONCAT44(bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,
                                 bottom_blobs.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data._M_finish._0_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (pAVar10 == (Allocator *)0x0) {
              free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              (*pAVar10->_vptr_Allocator[3])();
            }
          }
        }
        if (bVar12) {
          return 0;
        }
        return iVar15;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = top_blob->refcount;
      if (piVar9 == (int *)0x0) goto LAB_0024e6f9;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_0024e6f9;
      __ptr = top_blob->data;
      pAVar10 = top_blob->allocator;
    }
  }
  else {
    iVar16 = -100;
    if (iVar3 == 2) {
      if (iVar15 != _outh || local_150 != _outw) {
        Mat::create(top_blob,_outw,_outh,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
LAB_0024e246:
          copy_cut_border_image<float>(bottom_blob,top_blob,_hoffset,_woffset);
          return 0;
        }
        if (_elemsize == 2) {
LAB_0024e230:
          copy_cut_border_image<unsigned_short>(bottom_blob,top_blob,_hoffset,_woffset);
          return 0;
        }
        if (_elemsize != 1) {
          return 0;
        }
LAB_0024dfb4:
        copy_cut_border_image<signed_char>(bottom_blob,top_blob,_hoffset,_woffset);
        return 0;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = top_blob->refcount;
      if (piVar9 == (int *)0x0) goto LAB_0024e6f9;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_0024e6f9;
      __ptr = top_blob->data;
      pAVar10 = top_blob->allocator;
    }
    else {
      if (iVar3 != 1) goto LAB_0024e349;
      if (_outw != local_150) {
        Mat::create(top_blob,_outw,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
          _hoffset = 0;
          goto LAB_0024e246;
        }
        if (_elemsize == 2) {
          _hoffset = 0;
          goto LAB_0024e230;
        }
        if (_elemsize != 1) {
          return 0;
        }
        _hoffset = 0;
        goto LAB_0024dfb4;
      }
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar9 = bottom_blob->refcount;
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      piVar9 = top_blob->refcount;
      if (piVar9 == (int *)0x0) goto LAB_0024e6f9;
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) goto LAB_0024e6f9;
      __ptr = top_blob->data;
      pAVar10 = top_blob->allocator;
    }
  }
  if (pAVar10 == (Allocator *)0x0) {
    free(__ptr);
  }
  else {
    (*pAVar10->_vptr_Allocator[3])();
  }
LAB_0024e6f9:
  top_blob->cstep = 0;
  top_blob->data = (void *)0x0;
  top_blob->refcount = (int *)0x0;
  *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
  *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
  top_blob->c = 0;
  top_blob->dims = 0;
  top_blob->w = 0;
  top_blob->h = 0;
  top_blob->d = 0;
  piVar9 = bottom_blob->refcount;
  top_blob->data = bottom_blob->data;
  top_blob->refcount = piVar9;
  top_blob->elemsize = bottom_blob->elemsize;
  top_blob->elempack = bottom_blob->elempack;
  top_blob->allocator = bottom_blob->allocator;
  iVar15 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  top_blob->dims = bottom_blob->dims;
  top_blob->w = iVar15;
  top_blob->h = iVar1;
  top_blob->d = iVar2;
  top_blob->c = bottom_blob->c;
  top_blob->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        std::vector<Mat> bottom_blobs(1);
        bottom_blobs[0] = bottom_blob;
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}